

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

uchar mbedtls_ssl_sig_from_pk_alg(mbedtls_pk_type_t type)

{
  uchar uVar1;
  
  uVar1 = (uchar)(0x300030100 >> ((char)type * '\b' & 0x3fU));
  if (MBEDTLS_PK_ECDSA < type) {
    uVar1 = '\0';
  }
  return uVar1;
}

Assistant:

unsigned char mbedtls_ssl_sig_from_pk_alg( mbedtls_pk_type_t type )
{
    switch( type ) {
        case MBEDTLS_PK_RSA:
            return( MBEDTLS_SSL_SIG_RSA );
        case MBEDTLS_PK_ECDSA:
        case MBEDTLS_PK_ECKEY:
            return( MBEDTLS_SSL_SIG_ECDSA );
        default:
            return( MBEDTLS_SSL_SIG_ANON );
    }
}